

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-mqtt.c
# Opt level: O2

int rops_issue_keepalive_mqtt(lws *wsi,int isvalid)

{
  undefined1 *puVar1;
  lws *wsi_00;
  
  wsi_00 = lws_get_network_wsi(wsi);
  if (isvalid == 0) {
    puVar1 = &wsi_00->mqtt->field_0xfe;
    *puVar1 = *puVar1 | 1;
    lws_callback_on_writable(wsi_00);
  }
  else {
    _lws_validity_confirmed_role(wsi_00);
  }
  return 0;
}

Assistant:

static int
rops_issue_keepalive_mqtt(struct lws *wsi, int isvalid)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);

	if (isvalid) {
		_lws_validity_confirmed_role(nwsi);

		return 0;
	}

	nwsi->mqtt->send_pingreq = 1;
	lws_callback_on_writable(nwsi);

	return 0;
}